

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::TemplatedCustomNamer::getApprovedFile
          (string *__return_storage_ptr__,TemplatedCustomNamer *this,string *extensionWithDot)

{
  pointer pcVar1;
  string local_80;
  Path local_60;
  
  pcVar1 = (extensionWithDot->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + extensionWithDot->_M_string_length);
  getApprovedFileAsPath(&local_60,this,&local_80);
  Path::toString_abi_cxx11_(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.separator_._M_dataplus._M_p != &local_60.separator_.field_2) {
    operator_delete(local_60.separator_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.path_._M_dataplus._M_p != &local_60.path_.field_2) {
    operator_delete(local_60.path_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TemplatedCustomNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return getApprovedFileAsPath(extensionWithDot).toString();
    }